

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseColGroup(TidyDocImpl *doc,Node *colgroup,GetTokenMode mode)

{
  Dict *pDVar1;
  Bool BVar2;
  Node *node;
  Node *pNVar3;
  Node **ppNVar4;
  
  if ((colgroup->tag->model & 1) != 0) {
    return;
  }
LAB_00140fa3:
  do {
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) {
      return;
    }
    pDVar1 = node->tag;
    if (pDVar1 != colgroup->tag) {
      if (node->type != EndTag) goto LAB_00141002;
      pNVar3 = colgroup;
      if ((pDVar1 == (Dict *)0x0) || (pDVar1->id != TidyTag_FORM)) {
        while (pNVar3 = pNVar3->parent, pNVar3 != (Node *)0x0) {
          if (pDVar1 == pNVar3->tag) goto LAB_00141086;
        }
        goto LAB_00141002;
      }
      *(byte *)&doc->badForm = (byte)doc->badForm | 1;
      goto LAB_00141032;
    }
    if (node->type == EndTag) {
      prvTidyFreeNode(doc,node);
      colgroup->closed = yes;
      return;
    }
LAB_00141002:
    BVar2 = prvTidynodeIsText(node);
    if (BVar2 != no) goto LAB_00141086;
    BVar2 = InsertMisc(colgroup,node);
  } while (BVar2 != no);
  if (node->tag != (Dict *)0x0) {
    if (node->tag->id != TidyTag_COL) {
LAB_00141086:
      prvTidyUngetToken(doc);
      return;
    }
    if (node->type != EndTag) {
      node->parent = colgroup;
      pNVar3 = colgroup->last;
      node->prev = pNVar3;
      ppNVar4 = &pNVar3->next;
      if (pNVar3 == (Node *)0x0) {
        ppNVar4 = &colgroup->content;
      }
      *ppNVar4 = node;
      colgroup->last = node;
      ParseTag(doc,node,IgnoreWhitespace);
      goto LAB_00140fa3;
    }
  }
LAB_00141032:
  prvTidyReport(doc,colgroup,node,0x235);
  prvTidyFreeNode(doc,node);
  goto LAB_00140fa3;
}

Assistant:

void TY_(ParseColGroup)(TidyDocImpl* doc, Node *colgroup, GetTokenMode ARG_UNUSED(mode))
{
    Node *node, *parent;

    if (colgroup->tag->model & CM_EMPTY)
        return;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == colgroup->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            colgroup->closed = yes;
            return;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = colgroup->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(UngetToken)( doc );
                    return;
                }
            }
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(colgroup, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsCOL(node) )
        {
            TY_(UngetToken)( doc );
            return;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <COL> */
        TY_(InsertNodeAtEnd)(colgroup, node);
        ParseTag(doc, node, IgnoreWhitespace);
    }
}